

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fare_attributes.c
# Opt level: O0

transfers_state_t parse_transfer_state(char *value)

{
  int iVar1;
  char *value_local;
  
  iVar1 = strcmp(value,"0");
  if (iVar1 == 0) {
    value_local._4_4_ = TS_NOT_ALLOWED;
  }
  else {
    iVar1 = strcmp(value,"1");
    if (iVar1 == 0) {
      value_local._4_4_ = TS_ONCE;
    }
    else {
      iVar1 = strcmp(value,"2");
      if (iVar1 == 0) {
        value_local._4_4_ = TS_TWICE;
      }
      else {
        iVar1 = strcmp(value,"");
        if (iVar1 == 0) {
          value_local._4_4_ = TS_UNLIMITED;
        }
        else {
          value_local._4_4_ = TS_NOT_ALLOWED;
        }
      }
    }
  }
  return value_local._4_4_;
}

Assistant:

transfers_state_t parse_transfer_state(const char *value) {
    if (strcmp(value, "0") == 0)
        return TS_NOT_ALLOWED;
    else if (strcmp(value, "1") == 0)
        return TS_ONCE;
    else if (strcmp(value, "2") == 0)
        return TS_TWICE;
    else if (strcmp(value, "") == 0)
        return TS_UNLIMITED;
    else
        return TS_NOT_ALLOWED;
}